

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall Lib::List<Kernel::TermList>::FIFO::pushBack(FIFO *this,TermList elem)

{
  List<Kernel::TermList> *this_00;
  TermList in_RSI;
  undefined8 *in_RDI;
  List<Kernel::TermList> *newLast;
  
  this_00 = (List<Kernel::TermList> *)List<Kernel::TermList>::operator_new(0x857f42);
  List<Kernel::TermList>::List(this_00,in_RSI);
  if (in_RDI[1] == 0) {
    *in_RDI = this_00;
  }
  else {
    List<Kernel::TermList>::setTail((List<Kernel::TermList> *)in_RDI[1],this_00);
  }
  in_RDI[1] = this_00;
  return;
}

Assistant:

void pushBack(C elem)
    {
      List* newLast = new List(elem);
      if (_last) {
        _last->setTail(newLast);
      } else {
        _first = newLast;
      }
      _last = newLast;
    }